

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void disas_fp_int_conv(DisasContext_conflict1 *s,uint32_t insn)

{
  _Bool _Var1;
  uint32_t rd_00;
  uint32_t rn_00;
  uint32_t opcode_00;
  uint32_t rmode_00;
  uint32_t type_00;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  _Bool local_2b;
  _Bool itof;
  _Bool sf;
  _Bool sbit;
  int type;
  int rmode;
  int opcode;
  int rn;
  int rd;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  rd_00 = extract32(insn,0,5);
  rn_00 = extract32(insn,5,5);
  opcode_00 = extract32(insn,0x10,3);
  rmode_00 = extract32(insn,0x13,2);
  type_00 = extract32(insn,0x16,2);
  uVar2 = extract32(insn,0x1d,1);
  uVar3 = extract32(insn,0x1f,1);
  local_2b = false;
  if (uVar2 != 0) goto LAB_0082ac52;
  if (1 < opcode_00) {
    if (opcode_00 - 2 < 2) {
      local_2b = true;
    }
    else if (1 < opcode_00 - 4) {
      uVar4 = (uint)(uVar3 != 0) << 7 | type_00 << 5 | rmode_00 << 3 | opcode_00;
      if (uVar4 - 6 < 2) {
LAB_0082abde:
        _Var1 = fp_access_check(s);
        if (!_Var1) {
          return;
        }
        handle_fmov(s,rd_00,rn_00,type_00,(opcode_00 & 1) != 0);
        return;
      }
      if (uVar4 == 0x3e) {
        _Var1 = isar_feature_aa64_jscvt(s->isar);
        if (_Var1) {
          _Var1 = fp_access_check(s);
          if (!_Var1) {
            return;
          }
          handle_fjcvtzs(s,rd_00,rn_00);
          return;
        }
      }
      else {
        if (1 < uVar4 - 0x66) {
          if ((uVar4 - 0xa6 < 2) || (uVar4 - 0xce < 2)) goto LAB_0082abde;
          if (uVar4 != 0xe6 && uVar4 != 0xe7) goto LAB_0082ac52;
        }
        _Var1 = isar_feature_aa64_fp16(s->isar);
        if (_Var1) goto LAB_0082abde;
      }
      goto LAB_0082ac52;
    }
    if (rmode_00 != 0) goto LAB_0082ac52;
  }
  if ((type_00 < 2) || ((type_00 == 3 && (_Var1 = isar_feature_aa64_fp16(s->isar), _Var1)))) {
    _Var1 = fp_access_check(s);
    if (!_Var1) {
      return;
    }
    handle_fpfpcvt(s,rd_00,rn_00,opcode_00,local_2b,rmode_00,0x40,(uint)(uVar3 != 0),type_00);
    return;
  }
LAB_0082ac52:
  unallocated_encoding_aarch64(s);
  return;
}

Assistant:

static void disas_fp_int_conv(DisasContext *s, uint32_t insn)
{
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int opcode = extract32(insn, 16, 3);
    int rmode = extract32(insn, 19, 2);
    int type = extract32(insn, 22, 2);
    bool sbit = extract32(insn, 29, 1);
    bool sf = extract32(insn, 31, 1);
    bool itof = false;

    if (sbit) {
        goto do_unallocated;
    }

    switch (opcode) {
    case 2: /* SCVTF */
    case 3: /* UCVTF */
        itof = true;
        /* fallthru */
    case 4: /* FCVTAS */
    case 5: /* FCVTAU */
        if (rmode != 0) {
            goto do_unallocated;
        }
        /* fallthru */
    case 0: /* FCVT[NPMZ]S */
    case 1: /* FCVT[NPMZ]U */
        switch (type) {
        case 0: /* float32 */
        case 1: /* float64 */
            break;
        case 3: /* float16 */
            if (!dc_isar_feature(aa64_fp16, s)) {
                goto do_unallocated;
            }
            break;
        default:
            goto do_unallocated;
        }
        if (!fp_access_check(s)) {
            return;
        }
        handle_fpfpcvt(s, rd, rn, opcode, itof, rmode, 64, sf, type);
        break;

    default:
        switch (sf << 7 | type << 5 | rmode << 3 | opcode) {
        case 0x66: // 0b01100110: /* FMOV half <-> 32-bit int */
        case 0x67: // 0b01100111:
        case 0xe6: // 0b11100110: /* FMOV half <-> 64-bit int */
        case 0xe7: // 0b11100111:
            if (!dc_isar_feature(aa64_fp16, s)) {
                goto do_unallocated;
            }
            /* fallthru */
        case 6: // 0b00000110: /* FMOV 32-bit */
        case 7: // 0b00000111:
        case 0xa6: // 0b10100110: /* FMOV 64-bit */
        case 0xa7: // 0b10100111:
        case 0xce: // 0b11001110: /* FMOV top half of 128-bit */
        case 0xcf: // 0b11001111:
            if (!fp_access_check(s)) {
                return;
            }
            itof = opcode & 1;
            handle_fmov(s, rd, rn, type, itof);
            break;

        case 0x3e: // 0b00111110: /* FJCVTZS */
            if (!dc_isar_feature(aa64_jscvt, s)) {
                goto do_unallocated;
            } else if (fp_access_check(s)) {
                handle_fjcvtzs(s, rd, rn);
            }
            break;

        default:
        do_unallocated:
            unallocated_encoding(s);
            return;
        }
        break;
    }
}